

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O3

void __thiscall cppcms::impl::tcp_cache_service::session::store(session *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  base_cache *pbVar5;
  bool bVar6;
  pointer pcVar7;
  string data;
  string key;
  string ts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  triggers;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  char *local_78;
  undefined8 local_70;
  char local_68 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar1 = (this->hin_).operations.fetch.key_len;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ulong)uVar1 != 0) {
    uVar2 = (this->hin_).operations.store.data_len;
    uVar3 = (this->hin_).operations.store.triggers_len;
    if (uVar2 + uVar1 + uVar3 == (this->hin_).size) {
      local_70 = 0;
      local_68[0] = '\0';
      pcVar7 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar2 + (ulong)uVar1;
      local_78 = local_68;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&local_78,local_68,local_68,pcVar7,pcVar7 + uVar3);
      bVar6 = load_triggers(this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_58,local_78,(this->hin_).operations.store.triggers_len);
      if (bVar6) {
        uVar4 = (this->hin_).operations.fetch.current_gen;
        local_90 = 0;
        local_88[0] = 0;
        pcVar7 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_98 = local_88;
        std::__cxx11::string::
        _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&local_98,local_88,local_88,pcVar7,
                   pcVar7 + (this->hin_).operations.fetch.key_len);
        local_b0 = 0;
        local_a8[0] = 0;
        pcVar7 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + (this->hin_).operations.fetch.key_len;
        local_b8 = local_a8;
        std::__cxx11::string::
        _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&local_b8,local_a8,local_a8,pcVar7,
                   pcVar7 + (this->hin_).operations.store.data_len);
        pbVar5 = (this->cache_).p_;
        (*pbVar5->_vptr_base_cache[1])(pbVar5,&local_98,&local_b8,&local_58,uVar4,0);
        (this->hout_).opcode = 6;
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
      }
      else {
        (this->hout_).opcode = 5;
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      goto LAB_0022ea13;
    }
  }
  (this->hout_).opcode = 5;
LAB_0022ea13:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void store()
	{
		std::set<std::string> triggers;
		if(	hin_.operations.store.key_len
			+hin_.operations.store.data_len
			+hin_.operations.store.triggers_len != hin_.size
			|| hin_.operations.store.key_len == 0)
		{
			hout_.opcode=opcodes::error;
			return;
		}
		std::string ts;
		std::vector<char>::iterator p=data_in_.begin()
			+hin_.operations.store.key_len
			+hin_.operations.store.data_len;
		ts.assign(p,p + hin_.operations.store.triggers_len);
		if(!load_triggers(triggers,ts.c_str(),
					hin_.operations.store.triggers_len))
		{
			hout_.opcode=opcodes::error;
			return;
		}
		time_t timeout=to_time_t(hin_.operations.store.timeout);
		std::string key;
		key.assign(data_in_.begin(),data_in_.begin()+hin_.operations.store.key_len);
		std::string data;
		data.assign(data_in_.begin()+hin_.operations.store.key_len,
				data_in_.begin() + hin_.operations.store.key_len + hin_.operations.store.data_len);
		cache_->store(key,data,triggers,timeout);
		hout_.opcode=opcodes::done;
	}